

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O2

void __thiscall
ForeachStatement::ForeachStatement
          (ForeachStatement *this,ExpressionPtr *key,ExpressionPtr *value,ExpressionPtr *object,
          StatementPtr *block)

{
  (this->super_LoopBaseStatement).super_Statement.super_enable_shared_from_this<Statement>.
  _M_weak_this.super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_LoopBaseStatement).super_Statement.super_enable_shared_from_this<Statement>.
  _M_weak_this.super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_LoopBaseStatement).super_Statement._vptr_Statement =
       (_func_int **)&PTR_GetType_00128f00;
  (this->m_Key).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Key).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Value).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Value).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Object).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Object).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Block).super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Block).super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Key).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>,
             &key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Value).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>,
             &value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Object).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>,
             &object->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Block).super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>,
             &block->super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

explicit ForeachStatement( ExpressionPtr key, ExpressionPtr value, ExpressionPtr object, StatementPtr block )
	{
		m_Key = key;
		m_Value = value;
		m_Object = object;
		m_Block = block;
	}